

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmArea.c
# Opt level: O0

Vec_Int_t * Abc_NtkPrecomputeFirsts(Mio_Cell2_t *pCells,int nCells)

{
  int iVar1;
  Vec_Int_t *p;
  Vec_Int_t *vFirst;
  int local_18;
  int Index;
  int i;
  int nCells_local;
  Mio_Cell2_t *pCells_local;
  
  vFirst._4_4_ = 0;
  p = Vec_IntStartFull(2);
  for (local_18 = 2; local_18 < nCells; local_18 = local_18 + 1) {
    Vec_IntPush(p,vFirst._4_4_);
    vFirst._4_4_ = ((*(uint *)&pCells[local_18].field_0x10 >> 0x1c) + 1) * 3 + vFirst._4_4_;
  }
  iVar1 = Vec_IntSize(p);
  if (nCells == iVar1) {
    return p;
  }
  __assert_fail("nCells == Vec_IntSize(vFirst)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sfm/sfmArea.c"
                ,0x84,"Vec_Int_t *Abc_NtkPrecomputeFirsts(Mio_Cell2_t *, int)");
}

Assistant:

Vec_Int_t * Abc_NtkPrecomputeFirsts( Mio_Cell2_t * pCells, int nCells )
{
    int i, Index = 0;
    Vec_Int_t * vFirst = Vec_IntStartFull( 2 ); 
    for ( i = 2; i < nCells; i++ )
    {
        Vec_IntPush( vFirst, Index );
        Index += 3 * (pCells[i].nFanins + 1);
    }
    assert( nCells == Vec_IntSize(vFirst) );
    return vFirst;
}